

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O3

GLfloat getDistanceToClosestPoint(DelaunayTriangulation *delTri,GLfloat *point)

{
  GLsizei GVar1;
  float fVar2;
  GLfloat GVar3;
  float fVar4;
  
  GVar1 = getPointIndex(delTri,point);
  if (GVar1 == -1) {
    GVar3 = INFINITY;
  }
  else {
    fVar2 = *point - delTri->points[GVar1][0];
    fVar4 = point[1] - delTri->points[GVar1][1];
    GVar3 = fVar2 * fVar2 + fVar4 * fVar4;
  }
  return GVar3;
}

Assistant:

GLfloat getDistanceToClosestPoint(DelaunayTriangulation *delTri, GLfloat point[2]) {
	GLsizei idx = getPointIndex(delTri, point);
	if (idx != -1) {
		GLfloat dx, dy;
		dx = point[0] - delTri->points[idx][0];
		dy = point[1] - delTri->points[idx][1];
		return dx * dx + dy * dy;
	}
	else {
		return INFINITY;
	}
}